

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtBoxShape.cpp
# Opt level: O3

void __thiscall cbtBoxShape::cbtBoxShape(cbtBoxShape *this,cbtVector3 *boxHalfExtents)

{
  float fVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  
  cbtPolyhedralConvexShape::cbtPolyhedralConvexShape(&this->super_cbtPolyhedralConvexShape);
  (this->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.super_cbtConvexShape.
  super_cbtCollisionShape._vptr_cbtCollisionShape =
       (_func_int **)&PTR__cbtPolyhedralConvexShape_00b49368;
  (this->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.super_cbtConvexShape.
  super_cbtCollisionShape.m_shapeType = 0;
  uVar2 = *(undefined8 *)
           &(this->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.super_cbtConvexShape
            .super_cbtCollisionShape.field_0x1c;
  auVar3._0_4_ = (float)*(undefined8 *)boxHalfExtents->m_floats * (float)uVar2;
  auVar3._4_4_ = (float)((ulong)*(undefined8 *)boxHalfExtents->m_floats >> 0x20) *
                 (float)((ulong)uVar2 >> 0x20);
  auVar3._8_8_ = 0;
  fVar1 = (this->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.m_collisionMargin;
  auVar4._4_4_ = fVar1;
  auVar4._0_4_ = fVar1;
  auVar4._8_4_ = fVar1;
  auVar4._12_4_ = fVar1;
  auVar3 = vsubps_avx(auVar3,auVar4);
  auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)(boxHalfExtents->m_floats[2] *
                                               *(float *)&(this->super_cbtPolyhedralConvexShape).
                                                          super_cbtConvexInternalShape.field_0x24 -
                                              fVar1)),0x28);
  *(undefined1 (*) [16])
   (this->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.m_implicitShapeDimensions.
   m_floats = auVar3;
  cbtConvexInternalShape::setSafeMargin((cbtConvexInternalShape *)this,boxHalfExtents,0.1);
  return;
}

Assistant:

cbtBoxShape::cbtBoxShape(const cbtVector3& boxHalfExtents)
	: cbtPolyhedralConvexShape()
{
	m_shapeType = BOX_SHAPE_PROXYTYPE;

	cbtVector3 margin(getMargin(), getMargin(), getMargin());
	m_implicitShapeDimensions = (boxHalfExtents * m_localScaling) - margin;

	setSafeMargin(boxHalfExtents);
}